

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  char *ptr;
  ParseContext ctx;
  char *local_b0;
  internal *local_a8;
  int local_a0 [2];
  ParseContext local_98;
  
  ctx_00 = input._8_8_;
  local_a0[0] = (int)input.zcis;
  bVar1 = false;
  local_a8 = this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&local_98,io::CodedInputStream::default_recursion_limit_,false,&local_b0,
             (ZeroCopyInputStream **)&local_a8,local_a0);
  local_b0 = (char *)(**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x58))
                               (ctx_00,local_b0,&local_98);
  if (local_b0 != (char *)0x0) {
    EpsCopyInputStream::BackUp(&local_98.super_EpsCopyInputStream,local_b0);
    if (local_98.super_EpsCopyInputStream.last_tag_minus_1_ == 0) {
      bVar1 = anon_unknown_18::CheckFieldPresence
                        (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),parse_flags_00);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}